

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O3

exr_attr_chlist_entry_t * __thiscall
Imf_3_4::Context::findChannel(Context *this,int partidx,char *name)

{
  int iVar1;
  exr_attr_chlist_t *peVar2;
  size_t sVar3;
  long lVar4;
  exr_attr_chlist_entry_t *curc;
  exr_attr_chlist_entry_t *peVar5;
  
  peVar2 = channels(this,partidx);
  sVar3 = strlen(name);
  lVar4 = (long)peVar2->num_channels;
  if (0 < lVar4) {
    peVar5 = peVar2->entries;
    do {
      if (((peVar5->name).length == (int)sVar3) &&
         (iVar1 = bcmp(name,(peVar5->name).str,(long)(int)sVar3), iVar1 == 0)) {
        return peVar5;
      }
      peVar5 = peVar5 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return (exr_attr_chlist_entry_t *)0x0;
}

Assistant:

const exr_attr_chlist_entry_t* Context::findChannel (int partidx, const char* name) const
{
    const exr_attr_chlist_t* cl  = channels (partidx);
    int32_t                  len = strlen (name);

    for (int i = 0; i < cl->num_channels; ++i)
    {
        const exr_attr_chlist_entry_t* curc = cl->entries + i;
        if (curc->name.length == len && 0 == memcmp (name, curc->name.str, len))
        {
            return curc;
        }
    }
    return nullptr;
}